

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O2

void nsvg__roundCap(NSVGrasterizer *r,NSVGpoint *left,NSVGpoint *right,NSVGpoint *p,float dx,
                   float dy,float lineWidth,int ncap,int connect)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  float x0;
  float fVar5;
  float fVar6;
  float y0;
  float x1;
  float y1;
  float y0_00;
  float x0_00;
  float x1_00;
  float y1_00;
  float local_68;
  float fStack_64;
  
  iVar1 = ncap + -1;
  iVar4 = 0;
  if (ncap < 1) {
    ncap = 0;
  }
  uVar2 = p->x;
  uVar3 = p->y;
  x0 = 0.0;
  y0 = 0.0;
  x1 = 0.0;
  y1 = 0.0;
  y0_00 = 0.0;
  x0_00 = 0.0;
  for (; ncap != iVar4; iVar4 = iVar4 + 1) {
    fVar5 = ((float)iVar4 / (float)iVar1) * 3.1415927;
    fVar6 = cosf(fVar5);
    fVar6 = fVar6 * lineWidth * 0.5;
    fVar5 = sinf(fVar5);
    fVar5 = fVar5 * lineWidth * 0.5;
    x1_00 = fVar5 * -dx + fVar6 * -dy + (float)uVar2;
    y1_00 = fVar5 * -dy + fVar6 * dx + (float)uVar3;
    fVar5 = x1_00;
    fVar6 = y1_00;
    if ((iVar4 != 0) &&
       (nsvg__addEdge(r,x0_00,y0_00,x1_00,y1_00), fVar5 = x1, fVar6 = y1, iVar1 == iVar4)) {
      x0 = x1_00;
      y0 = y1_00;
    }
    x1 = fVar5;
    y1 = fVar6;
    y0_00 = y1_00;
    x0_00 = x1_00;
  }
  if (connect != 0) {
    nsvg__addEdge(r,left->x,left->y,x1,y1);
    nsvg__addEdge(r,x0,y0,right->x,right->y);
  }
  left->x = x1;
  left->y = y1;
  right->x = x0;
  right->y = y0;
  return;
}

Assistant:

static void nsvg__roundCap(NSVGrasterizer* r, NSVGpoint* left, NSVGpoint* right, NSVGpoint* p, float dx, float dy, float lineWidth, int ncap, int connect)
{
	int i;
	float w = lineWidth * 0.5f;
	float px = p->x, py = p->y;
	float dlx = dy, dly = -dx;
	float lx = 0, ly = 0, rx = 0, ry = 0, prevx = 0, prevy = 0;

	for (i = 0; i < ncap; i++) {
		float a = (float)i/(float)(ncap-1)*NSVG_PI;
		float ax = cosf(a) * w, ay = sinf(a) * w;
		float x = px - dlx*ax - dx*ay;
		float y = py - dly*ax - dy*ay;

		if (i > 0)
			nsvg__addEdge(r, prevx, prevy, x, y);

		prevx = x;
		prevy = y;

		if (i == 0) {
			lx = x; ly = y;
		} else if (i == ncap-1) {
			rx = x; ry = y;
		}
	}

	if (connect) {
		nsvg__addEdge(r, left->x, left->y, lx, ly);
		nsvg__addEdge(r, rx, ry, right->x, right->y);
	}

	left->x = lx; left->y = ly;
	right->x = rx; right->y = ry;
}